

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O0

bool google::FindSymbol(uint64_t pc,int fd,char *out,size_t out_size,uint64_t symbol_offset,
                       Elf64_Shdr *strtab,Elf64_Shdr *symtab)

{
  Elf64_Sym *pEVar1;
  long lVar2;
  unsigned_long *puVar3;
  ulong uVar4;
  ulong uVar5;
  ssize_t sVar6;
  void *pvVar7;
  ulong uVar8;
  ssize_t len1;
  uint64_t end_address;
  uint64_t start_address;
  Elf64_Sym *symbol;
  uint j;
  size_t num_symbols_in_buf;
  ssize_t len;
  ulong local_370;
  size_t num_symbols_to_read;
  Elf64_Sym buf [32];
  unsigned_long local_60;
  size_t NUM_SYMBOLS;
  size_t offset;
  ulong uStack_48;
  uint i;
  size_t num_symbols;
  Elf64_Shdr *strtab_local;
  uint64_t symbol_offset_local;
  size_t out_size_local;
  char *out_local;
  uint64_t uStack_18;
  int fd_local;
  uint64_t pc_local;
  
  if (symtab != (Elf64_Shdr *)0x0) {
    uStack_48 = symtab->sh_size / symtab->sh_entsize;
    num_symbols = (size_t)strtab;
    strtab_local = (Elf64_Shdr *)symbol_offset;
    symbol_offset_local = out_size;
    out_size_local = (size_t)out;
    out_local._4_4_ = fd;
    uStack_18 = pc;
    for (offset._4_4_ = 0; offset._4_4_ < uStack_48; offset._4_4_ = offset._4_4_ + (int)uVar4) {
      NUM_SYMBOLS = symtab->sh_offset + (ulong)offset._4_4_ * symtab->sh_entsize;
      local_60 = 0x20;
      len = uStack_48 - offset._4_4_;
      puVar3 = std::min<unsigned_long>(&local_60,(unsigned_long *)&len);
      local_370 = *puVar3;
      uVar4 = ReadFromOffset(out_local._4_4_,&num_symbols_to_read,local_370 * 0x18,NUM_SYMBOLS);
      if (uVar4 % 0x18 != 0) {
        abort();
      }
      uVar4 = uVar4 / 0x18;
      if (local_370 < uVar4) {
        abort();
      }
      for (symbol._4_4_ = 0; symbol._4_4_ < uVar4; symbol._4_4_ = symbol._4_4_ + 1) {
        uVar8 = (ulong)symbol._4_4_;
        uVar5 = (long)&strtab_local->sh_name + *(long *)(buf + uVar8);
        pEVar1 = buf + uVar8;
        lVar2._0_4_ = pEVar1->st_name;
        lVar2._4_1_ = pEVar1->st_info;
        lVar2._5_1_ = pEVar1->st_other;
        lVar2._6_2_ = pEVar1->st_shndx;
        if ((((lVar2 != 0) && (*(short *)((long)&buf[uVar8 - 1].st_size + 6) != 0)) &&
            (uVar5 <= uStack_18)) && (uStack_18 < uVar5 + buf[uVar8].st_value)) {
          sVar6 = ReadFromOffset(out_local._4_4_,(void *)out_size_local,symbol_offset_local,
                                 *(long *)(num_symbols + 0x18) + (ulong)(uint)buf[uVar8 - 1].st_size
                                );
          if ((0 < sVar6) &&
             (pvVar7 = memchr((void *)out_size_local,0,symbol_offset_local), pvVar7 != (void *)0x0))
          {
            return true;
          }
          memset((void *)out_size_local,0,symbol_offset_local);
          return false;
        }
      }
    }
  }
  return false;
}

Assistant:

static ATTRIBUTE_NOINLINE bool FindSymbol(uint64_t pc, const int fd, char* out,
                                          size_t out_size,
                                          uint64_t symbol_offset,
                                          const ElfW(Shdr) * strtab,
                                          const ElfW(Shdr) * symtab) {
  if (symtab == nullptr) {
    return false;
  }
  const size_t num_symbols = symtab->sh_size / symtab->sh_entsize;
  for (unsigned i = 0; i < num_symbols;) {
    size_t offset = symtab->sh_offset + i * symtab->sh_entsize;

    // If we are reading Elf64_Sym's, we want to limit this array to
    // 32 elements (to keep stack consumption low), otherwise we can
    // have a 64 element Elf32_Sym array.
#    if defined(__WORDSIZE) && __WORDSIZE == 64
    const size_t NUM_SYMBOLS = 32U;
#    else
    const size_t NUM_SYMBOLS = 64U;
#    endif

    // Read at most NUM_SYMBOLS symbols at once to save read() calls.
    ElfW(Sym) buf[NUM_SYMBOLS];
    size_t num_symbols_to_read = std::min(NUM_SYMBOLS, num_symbols - i);
    const ssize_t len =
        ReadFromOffset(fd, &buf, sizeof(buf[0]) * num_symbols_to_read, offset);
    GLOG_SAFE_ASSERT(static_cast<size_t>(len) % sizeof(buf[0]) == 0);
    const size_t num_symbols_in_buf = static_cast<size_t>(len) / sizeof(buf[0]);
    GLOG_SAFE_ASSERT(num_symbols_in_buf <= num_symbols_to_read);
    for (unsigned j = 0; j < num_symbols_in_buf; ++j) {
      const ElfW(Sym)& symbol = buf[j];
      uint64_t start_address = symbol.st_value;
      start_address += symbol_offset;
      uint64_t end_address = start_address + symbol.st_size;
      if (symbol.st_value != 0 &&  // Skip null value symbols.
          symbol.st_shndx != 0 &&  // Skip undefined symbols.
          start_address <= pc && pc < end_address) {
        ssize_t len1 = ReadFromOffset(fd, out, out_size,
                                      strtab->sh_offset + symbol.st_name);
        if (len1 <= 0 || memchr(out, '\0', out_size) == nullptr) {
          memset(out, 0, out_size);
          return false;
        }
        return true;  // Obtained the symbol name.
      }
    }
    i += num_symbols_in_buf;
  }
  return false;
}